

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<char>::parse_selection(NFA<char> *this,Stream *stream,wchar_t ch)

{
  wchar_t ch_00;
  fd_set *pfVar1;
  fd_set *__writefds;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  NFA<char> nfa;
  NFA<char> local_48;
  
  parse_unit(this,stream,ch);
  pfVar1 = (fd_set *)(stream->m_cur)._M_current;
  __writefds = (fd_set *)((stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length);
  if (pfVar1 != __writefds) {
    do {
      if ((int)pfVar1->fds_bits[0] != 0x7c) {
        return;
      }
      Stream::get(stream);
      NFA(&local_48);
      ch_00 = Stream::get(stream);
      parse_unit(&local_48,stream,ch_00);
      select(this,(int)&local_48,__readfds,__writefds,in_R8,in_R9);
      local_48.super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
           (_func_int **)&PTR__NFABase_0019a420;
      std::
      vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
      ::~vector(&local_48.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states);
      pfVar1 = (fd_set *)(stream->m_cur)._M_current;
      __writefds = (fd_set *)((stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length);
    } while (pfVar1 != __writefds);
  }
  return;
}

Assistant:

void parse_selection(Stream& stream, wchar_t ch)
    {
        parse_unit(stream, ch);

        while (true)
        {
            ch = stream.peek();

            if (ch != L'|')
            {
                break;
            }

            stream.discard();

            NFA<TCHAR> nfa;
            nfa.parse_unit(stream, stream.get());
            select(nfa);
        }
    }